

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::write_activated(session_base_t *this)

{
  pipe_t *in_stack_00000008;
  session_base_t *in_stack_00000010;
  
  write_activated(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void zmq::session_base_t::write_activated (pipe_t *pipe_)
{
    // Skip activating if we're detaching this pipe
    if (_pipe != pipe_) {
        zmq_assert (_terminating_pipes.count (pipe_) == 1);
        return;
    }

    if (_engine)
        _engine->restart_input ();
}